

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O1

void __thiscall Histogram::Histogram(Histogram *this,double base)

{
  double dVar1;
  size_t i;
  HistBin *pHVar2;
  long lVar3;
  
  this->EXP_BASE = base;
  dVar1 = log(base);
  this->EXP_BASE_LOG = dVar1;
  (this->count).super___atomic_base<unsigned_long>._M_i = 0;
  (this->sum).super___atomic_base<unsigned_long>._M_i = 0;
  (this->max).super___atomic_base<unsigned_long>._M_i = 0;
  pHVar2 = (HistBin *)operator_new__(0x208);
  this->bins = pHVar2;
  lVar3 = 0;
  do {
    LOCK();
    this->bins[lVar3].super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x41);
  return;
}

Assistant:

Histogram(double base = 2.0)
        : EXP_BASE(base)
        , EXP_BASE_LOG( log(base) )
        , count(0)
        , sum(0)
        , max(0)
    {
        bins = new HistBin[MAX_BINS];
        for (size_t i=0; i<MAX_BINS; ++i) {
            bins[i] = 0;
        }
    }